

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_comparison.cpp
# Opt level: O2

void duckdb::UpdateNullMask
               (Vector *vec,optional_ptr<const_duckdb::SelectionVector,_true> sel,idx_t count,
               ValidityMask *null_mask)

{
  SelectionVector *pSVar1;
  ulong uVar2;
  ulong row_idx;
  idx_t i;
  ulong uVar3;
  UnifiedVectorFormat vdata;
  optional_ptr<const_duckdb::SelectionVector,_true> local_78;
  UnifiedVectorFormat local_70;
  
  local_78.ptr = sel.ptr;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  Vector::ToUnifiedFormat(vec,count,&local_70);
  if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
      (unsigned_long *)0x0) {
    if (sel.ptr == (SelectionVector *)0x0) {
      local_78.ptr = FlatVector::IncrementalSelectionVector();
    }
    for (uVar3 = 0; count != uVar3; uVar3 = uVar3 + 1) {
      pSVar1 = optional_ptr<const_duckdb::SelectionVector,_true>::operator->(&local_78);
      row_idx = uVar3;
      if (pSVar1->sel_vector != (sel_t *)0x0) {
        row_idx = (ulong)pSVar1->sel_vector[uVar3];
      }
      uVar2 = uVar3;
      if ((local_70.sel)->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)(local_70.sel)->sel_vector[uVar3];
      }
      if ((local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
           (unsigned_long *)0x0) &&
         ((local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar2 >> 6] >>
           (uVar2 & 0x3f) & 1) == 0)) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&null_mask->super_TemplatedValidityMask<unsigned_long>,row_idx);
      }
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_70);
  return;
}

Assistant:

static void UpdateNullMask(Vector &vec, optional_ptr<const SelectionVector> sel, idx_t count, ValidityMask &null_mask) {
	UnifiedVectorFormat vdata;
	vec.ToUnifiedFormat(count, vdata);

	if (vdata.validity.AllValid()) {
		return;
	}

	if (!sel) {
		sel = FlatVector::IncrementalSelectionVector();
	}

	for (idx_t i = 0; i < count; ++i) {
		const auto ridx = sel->get_index(i);
		const auto vidx = vdata.sel->get_index(i);
		if (!vdata.validity.RowIsValid(vidx)) {
			null_mask.SetInvalid(ridx);
		}
	}
}